

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O3

bool __thiscall DBot::Reachable(DBot *this,AActor *rtarget)

{
  APlayerPawn *pAVar1;
  sector_t *psVar2;
  line_t_conflict *plVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  intercept_t *piVar8;
  bool bVar9;
  sector_t_conflict *psVar10;
  sector_t_conflict *sec;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  FPathTraverse it;
  double local_98;
  FPathTraverse local_70;
  
  pAVar1 = this->player->mo;
  if ((pAVar1 == (APlayerPawn *)rtarget) ||
     (psVar2 = rtarget->Sector, dVar13 = (rtarget->__Pos).X, dVar12 = (rtarget->__Pos).Y,
     (psVar2->ceilingplane).negiC *
     ((psVar2->ceilingplane).normal.Y * dVar12 +
     (psVar2->ceilingplane).D + (psVar2->ceilingplane).normal.X * dVar13) -
     (psVar2->floorplane).negiC *
     ((psVar2->floorplane).normal.Y * dVar12 +
     (psVar2->floorplane).D + (psVar2->floorplane).normal.X * dVar13) <
     (pAVar1->super_AActor).Height)) {
    bVar7 = false;
  }
  else {
    psVar10 = (sector_t_conflict *)(pAVar1->super_AActor).Sector;
    dVar14 = (psVar10->floorplane).normal.X;
    dVar4 = (psVar10->floorplane).normal.Y;
    dVar5 = (pAVar1->super_AActor).__Pos.X;
    dVar6 = (pAVar1->super_AActor).__Pos.Y;
    dVar13 = (psVar10->floorplane).D;
    dVar12 = (psVar10->floorplane).negiC;
    dVar11 = AActor::Distance2D(&pAVar1->super_AActor,rtarget,false);
    local_70._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fa0a8;
    FPathTraverse::init(&local_70,(EVP_PKEY_CTX *)0x3);
    bVar9 = true;
    local_98 = (dVar6 * dVar4 + dVar13 + dVar5 * dVar14) * dVar12;
    do {
      while( true ) {
        piVar8 = FPathTraverse::Next(&local_70);
        bVar7 = bVar9;
        if (piVar8 == (intercept_t *)0x0) goto LAB_0034bcd7;
        dVar13 = piVar8->frac + -0.00262144;
        pAVar1 = this->player->mo;
        if (piVar8->isaline == true) break;
        bVar7 = true;
        if (dVar11 < dVar13 * 1525.87890625) goto LAB_0034bcd7;
        if (((APlayerPawn *)(piVar8->d).thing != pAVar1) &&
           (bVar9 = false, (APlayerPawn *)(piVar8->d).thing == (APlayerPawn *)rtarget)) {
          psVar2 = rtarget->Sector;
          bVar9 = false;
          if (((rtarget->__Pos).Y * (psVar2->floorplane).normal.Y +
              (psVar2->floorplane).D + (rtarget->__Pos).X * (psVar2->floorplane).normal.X) *
              (psVar2->floorplane).negiC <= local_98 + 32.0) goto LAB_0034bcd7;
        }
      }
      plVar3 = (piVar8->d).line;
      if ((plVar3->flags & 0xc005) != 4) break;
      sec = plVar3->backsector;
      if (sec == psVar10) {
        sec = plVar3->frontsector;
      }
      dVar12 = (pAVar1->super_AActor).Vel.X * dVar13 + local_70.trace.x;
      dVar13 = dVar13 * (pAVar1->super_AActor).Vel.Y + local_70.trace.y;
      dVar14 = ((sec->ceilingplane).normal.Y * dVar13 +
               (sec->ceilingplane).normal.X * dVar12 + (sec->ceilingplane).D) *
               (sec->ceilingplane).negiC;
      dVar13 = (dVar13 * (sec->floorplane).normal.Y +
               dVar12 * (sec->floorplane).normal.X + (sec->floorplane).D) * (sec->floorplane).negiC;
      bVar7 = FCajunMaster::IsDangerous(&bglobal,(sector_t *)sec);
      if (bVar7 || local_98 + 32.0 < dVar13) break;
      psVar10 = sec;
      local_98 = dVar13;
    } while ((((dVar14 == dVar13) && (!NAN(dVar14) && !NAN(dVar13))) && (plVar3->special != 0)) ||
            ((this->player->mo->super_AActor).Height <= dVar14 - dVar13));
    bVar7 = false;
LAB_0034bcd7:
    FPathTraverse::~FPathTraverse(&local_70);
  }
  return bVar7;
}

Assistant:

bool DBot::Reachable (AActor *rtarget)
{
	if (player->mo == rtarget)
		return false;

	if ((rtarget->Sector->ceilingplane.ZatPoint (rtarget) -
		 rtarget->Sector->floorplane.ZatPoint (rtarget))
		< player->mo->Height) //Where rtarget is, player->mo can't be.
		return false;

	sector_t *last_s = player->mo->Sector;
	double last_z = last_s->floorplane.ZatPoint (player->mo);
	double estimated_dist = player->mo->Distance2D(rtarget);
	bool reachable = true;

	FPathTraverse it(player->mo->X()+player->mo->Vel.X, player->mo->Y()+player->mo->Vel.Y, rtarget->X(), rtarget->Y(), PT_ADDLINES|PT_ADDTHINGS);
	intercept_t *in;
	while ((in = it.Next()))
	{
		double hitx, hity;
		double frac;
		line_t *line;
		AActor *thing;
		double dist;
		sector_t *s;

		frac = in->frac - 4 /MAX_TRAVERSE_DIST;
		dist = frac * MAX_TRAVERSE_DIST;

		hitx = it.Trace().x + player->mo->Vel.X * frac;
		hity = it.Trace().y + player->mo->Vel.Y * frac;

		if (in->isaline)
		{
			line = in->d.line;

			if (!(line->flags & ML_TWOSIDED) || (line->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING|ML_BLOCK_PLAYERS)))
			{
				return false; //Cannot continue.
			}
			else
			{
				//Determine if going to use backsector/frontsector.
				s = (line->backsector == last_s) ? line->frontsector : line->backsector;
				double ceilingheight = s->ceilingplane.ZatPoint (hitx, hity);
				double floorheight = s->floorplane.ZatPoint (hitx, hity);

				if (!bglobal.IsDangerous (s) &&		//Any nukage/lava?
					(floorheight <= (last_z+MAXMOVEHEIGHT)
					&& ((ceilingheight == floorheight && line->special)
						|| (ceilingheight - floorheight) >= player->mo->Height))) //Does it fit?
				{
					last_z = floorheight;
					last_s = s;
					continue;
				}
				else
				{
					return false;
				}
			}
		}

		if (dist > estimated_dist)
		{
			return true;
		}

		thing = in->d.thing;
		if (thing == player->mo) //Can't reach self in this case.
			continue;
		if (thing == rtarget && (rtarget->Sector->floorplane.ZatPoint (rtarget) <= (last_z+MAXMOVEHEIGHT)))
		{
			return true;
		}

		reachable = false;
	}
	return reachable;
}